

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkService.h
# Opt level: O1

void __thiscall
WorkerContext::WorkerContext
          (WorkerContext *this,string *identity,DatabaseSnapshot *snap,TaskSpec *task)

{
  pointer pcVar1;
  pointer ppOVar2;
  undefined1 local_48 [32];
  bool local_28;
  
  (this->identity)._M_dataplus._M_p = (pointer)&(this->identity).field_2;
  pcVar1 = (identity->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + identity->_M_string_length);
  std::experimental::filesystem::v1::__cxx11::path::path(&(this->snap).db_name,&snap->db_name);
  std::experimental::filesystem::v1::__cxx11::path::path(&(this->snap).db_base,&snap->db_base);
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->snap).iterators._M_t._M_impl.super__Rb_tree_header,
             &(snap->iterators)._M_t._M_impl.super__Rb_tree_header);
  (this->snap).config.config_.m_type = (snap->config).config_.m_type;
  (this->snap).config.config_.m_value = (snap->config).config_.m_value;
  (snap->config).config_.m_type = null;
  (snap->config).config_.m_value.object = (object_t *)0x0;
  ppOVar2 = (snap->datasets).
            super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  (this->snap).datasets.
  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (snap->datasets).
       super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->snap).datasets.
  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppOVar2;
  (this->snap).datasets.
  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (snap->datasets).
       super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (snap->datasets).super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (snap->datasets).super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (snap->datasets).super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->snap).locked_datasets._M_t._M_impl.super__Rb_tree_header,
             &(snap->locked_datasets)._M_t._M_impl.super__Rb_tree_header);
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->snap).locked_iterators._M_t._M_impl.super__Rb_tree_header,
             &(snap->locked_iterators)._M_t._M_impl.super__Rb_tree_header);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_TaskSpec>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&(this->snap).tasks._M_h,&snap->tasks,&snap->tasks);
  (this->task).super__Optional_base<Task,_false,_false>._M_payload.
  super__Optional_payload<Task,_true,_false,_false>.super__Optional_payload_base<Task>._M_engaged =
       false;
  if (task != (TaskSpec *)0x0) {
    local_48._8_8_ = (pointer)0x0;
    local_48._16_8_ = (pointer)0x0;
    local_48._24_8_ = (pointer)0x0;
    local_28 = true;
    local_48._0_8_ = task;
    std::_Optional_payload_base<Task>::_M_move_assign
              ((_Optional_payload_base<Task> *)&this->task,(_Optional_payload_base<Task> *)local_48)
    ;
    if (local_28 == true) {
      local_28 = false;
      std::vector<DBChange,_std::allocator<DBChange>_>::~vector
                ((vector<DBChange,_std::allocator<DBChange>_> *)(local_48 + 8));
    }
  }
  return;
}

Assistant:

WorkerContext(std::string identity, DatabaseSnapshot &&snap, TaskSpec *task)
        : identity(identity), snap(std::move(snap)) {
        if (task != nullptr) {
            this->task = std::make_optional<Task>(task);
        }
    }